

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O0

string * __thiscall BamTools::Internal::HostInfo::HostName_abi_cxx11_(HostInfo *this)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string HostInfo::HostName() const
{
    return m_hostName;
}